

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void ArraySortEx(array *p,size_t Count,size_t Width,arraycmp Cmp,void *CmpParam,bool_t Unique)

{
  uint_fast32_t *puVar1;
  uint_fast32_t *puVar2;
  int iVar3;
  uint_fast32_t *puVar4;
  char *pcVar5;
  uint_fast32_t *puVar6;
  uint_fast32_t *puVar7;
  char *pcVar8;
  uint_fast32_t Tmp;
  uint_fast32_t local_48;
  bool_t local_40;
  uint_fast32_t *local_38;
  
  if (Count == 0xffffffffffffffff) {
    Count = p->_Used / Width;
  }
  if (1 < Count) {
    if (Width != 8) {
      SlowSort(p,Count,Width,Cmp,CmpParam,Unique);
      return;
    }
    local_40 = Unique;
    if (p == (array *)0x0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x194,
                    "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)");
    }
    puVar7 = (uint_fast32_t *)p->_Begin;
    puVar6 = puVar7 + Count;
    InQSort(puVar7,puVar7 + (Count - 1),Cmp,CmpParam);
    puVar7 = (uint_fast32_t *)p->_Begin;
    puVar1 = puVar7 + 1;
    puVar2 = puVar6;
    if (puVar7 + 1 != puVar6) {
      do {
        local_38 = puVar2;
        puVar4 = puVar1;
        iVar3 = (*Cmp)(CmpParam,puVar4,puVar7);
        if (iVar3 < 0) {
          local_48 = *puVar4;
          do {
            puVar6 = puVar7;
            puVar6[1] = *puVar6;
            if (puVar6 == (uint_fast32_t *)p->_Begin) break;
            iVar3 = (*Cmp)(CmpParam,&local_48,puVar6 + -1);
            puVar7 = puVar6 + -1;
          } while (iVar3 < 0);
          *puVar6 = local_48;
          puVar6 = local_38;
        }
        puVar1 = puVar4 + 1;
        puVar7 = puVar4;
        puVar2 = local_38;
      } while (puVar4 + 1 != puVar6);
    }
    if (local_40 != 0) {
      pcVar5 = p->_Begin;
      puVar7 = (uint_fast32_t *)(pcVar5 + 8);
      pcVar8 = pcVar5;
      if (puVar7 != puVar6) {
        do {
          iVar3 = (*Cmp)(CmpParam,puVar7,pcVar8);
          if (iVar3 != 0) {
            *(uint_fast32_t *)(pcVar8 + 8) = *puVar7;
            pcVar8 = pcVar8 + 8;
          }
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar6);
        pcVar5 = p->_Begin;
      }
      p->_Used = (size_t)(pcVar8 + (8 - (long)pcVar5));
    }
  }
  return;
}

Assistant:

void ArraySortEx(array* p, size_t Count, size_t Width, arraycmp Cmp, const void* CmpParam, bool_t Unique)
{
    if (Count == ARRAY_AUTO_COUNT)
        Count = ArraySize(p)/Width;

    if (Count<=1)
        return;

    if (Width == sizeof(uint_fast32_t))
    {
        uint_fast32_t* End = ARRAYBEGIN(*p,uint_fast32_t)+Count;
        uint_fast32_t* i;
        uint_fast32_t* j;

        InQSort(ARRAYBEGIN(*p,uint_fast32_t), End-1, Cmp, CmpParam);

        j = ARRAYBEGIN(*p,uint_fast32_t);
        for (i=j+1; i!=End; ++i)
        {
            if (Cmp(CmpParam,i,j) < 0)
            {
                uint_fast32_t Tmp = *i;
                do
                {
                    j[1] = j[0];
                    if (j-- == ARRAYBEGIN(*p,uint_fast32_t))
                        break;
                }
                while (Cmp(CmpParam,&Tmp,j) < 0);
                j[1] = Tmp;
            }
            j = i;
        }

        if (Unique)
        {
            j = ARRAYBEGIN(*p,uint_fast32_t);
            for (i=j+1; i!=End; ++i)
            {
                if (Cmp(CmpParam,i,j) != 0)
                    *(++j) = *i;
            }
            p->_Used = ((j+1)-ARRAYBEGIN(*p,uint_fast32_t)) * sizeof(uint_fast32_t);
        }
        return;
    }

    SlowSort(p, Count, Width, Cmp, CmpParam, Unique);
}